

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  Arena *this_00;
  string *from;
  uint uVar1;
  string *to;
  long lVar2;
  ulong uVar3;
  
  uVar1 = length;
  if (already_allocated < length) {
    uVar1 = already_allocated;
  }
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Merge((string *)other_elems[uVar3],(string *)our_elems[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  if (already_allocated < length) {
    this_00 = this->arena_;
    lVar2 = 0;
    do {
      from = (string *)other_elems[already_allocated + lVar2];
      if (this_00 == (Arena *)0x0) {
        to = (string *)operator_new(0x20);
        (to->_M_dataplus)._M_p = (pointer)&to->field_2;
        to->_M_string_length = 0;
        (to->field_2)._M_local_buf[0] = '\0';
      }
      else {
        to = (string *)
             Arena::AllocateAligned(this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
        (to->_M_dataplus)._M_p = (pointer)&to->field_2;
        to->_M_string_length = 0;
        (to->field_2)._M_local_buf[0] = '\0';
        Arena::AddListNode(this_00,to,arena_destruct_object<std::__cxx11::string>);
      }
      GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Merge(from,to);
      our_elems[already_allocated + lVar2] = to;
      lVar2 = lVar2 + 1;
    } while (length - already_allocated != (int)lVar2);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(
    void** our_elems, void** other_elems, int length, int already_allocated) {
  // Split into two loops, over ranges [0, allocated) and [allocated, length),
  // to avoid a branch within the loop.
  for (int i = 0; i < already_allocated && i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
  Arena* arena = GetArenaNoVirtual();
  for (int i = already_allocated; i < length; i++) {
    // Not allocated: alloc a new element first, then merge it.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        TypeHandler::NewFromPrototype(other_elem, arena);
    TypeHandler::Merge(*other_elem, new_elem);
    our_elems[i] = new_elem;
  }
}